

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall
CppJieba::Trie::find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          *res)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *ppTVar3;
  ulong uVar4;
  size_type sVar5;
  unsigned_short *in_RSI;
  Trie *in_RDI;
  uint pos;
  const_iterator itr;
  TrieNode *p;
  value_type *in_stack_fffffffffffffe78;
  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
  *in_stack_fffffffffffffe80;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_stack_fffffffffffffe88;
  allocator *paVar6;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  *in_stack_fffffffffffffe90;
  char *local_138;
  char *local_120;
  allocator local_101;
  string local_100 [32];
  const_reference local_e0;
  difference_type local_d8;
  pair<long,_const_CppJieba::TrieNodeInfo_*> local_d0;
  pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> local_c0;
  uint local_ac;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> local_a0;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_98;
  mapped_type local_90;
  allocator local_81;
  string local_80 [24];
  string local_48 [56];
  unsigned_short *local_10;
  bool local_1;
  
  local_10 = in_RSI;
  bVar1 = _getInitFlag(in_RDI);
  if (bVar1) {
    bVar1 = __gnu_cxx::operator>=
                      ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_fffffffffffffe78);
    if (bVar1) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_138 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
      }
      else {
        local_138 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                            ,0x2f);
        local_138 = local_138 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"begin >= end",&local_81);
      Limonp::Logger::LoggingF(4,local_138,0xdb,(string *)local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_1 = false;
    }
    else {
      local_90 = in_RDI->_root;
      local_98._M_current = local_10;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)in_stack_fffffffffffffe78), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::operator*(&local_98);
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
             ::find((unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
                     *)in_stack_fffffffffffffe78,(key_type *)0x139f44);
        local_a8._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
             ::end((unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
                    *)in_stack_fffffffffffffe78);
        bVar1 = std::__detail::operator==(&local_a0,&local_a8);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::operator*(&local_98);
        ppTVar3 = std::
                  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
                  ::operator[](in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
        local_90 = *ppTVar3;
        if ((local_90->isLeaf & 1U) != 0) {
          local_ac = local_90->nodeInfoVecPos;
          uVar4 = (ulong)local_ac;
          sVar5 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::size
                            (&in_RDI->_nodeInfoVec);
          if (sVar5 <= uVar4) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                             ,0x2f);
            if (pcVar2 == (char *)0x0) {
              pcVar2 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
              ;
            }
            else {
              pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                               ,0x2f);
              pcVar2 = pcVar2 + 1;
            }
            paVar6 = &local_101;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_100,"node\'s nodeInfoVecPos is out of _nodeInfoVec\'s range",paVar6);
            Limonp::Logger::LoggingF(4,pcVar2,0xef,(string *)local_100);
            std::__cxx11::string::~string(local_100);
            std::allocator<char>::~allocator((allocator<char> *)&local_101);
            return false;
          }
          local_d8 = __gnu_cxx::operator-
                               ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)in_stack_fffffffffffffe78);
          local_e0 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::
                     operator[](&in_RDI->_nodeInfoVec,(ulong)local_ac);
          local_d0 = std::make_pair<long,CppJieba::TrieNodeInfo_const*>
                               ((long *)in_stack_fffffffffffffe80,
                                (TrieNodeInfo **)in_stack_fffffffffffffe78);
          std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>::
          pair<long,_const_CppJieba::TrieNodeInfo_*,_true>(&local_c0,&local_d0);
          std::
          vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ::push_back((vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                       *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::operator++(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      }
      bVar1 = std::
              vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
              ::empty(in_stack_fffffffffffffe90);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_120 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
    }
    else {
      local_120 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                          ,0x2f);
      local_120 = local_120 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"trie not initted!",(allocator *)&stack0xffffffffffffffb7)
    ;
    Limonp::Logger::LoggingF(4,local_120,0xd6,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool find(Unicode::const_iterator begin, Unicode::const_iterator end, vector<pair<uint, const TrieNodeInfo*> >& res) const
            {
                if(!_getInitFlag())
                {
                    LogFatal("trie not initted!");
                    return false;
                }
                if (begin >= end) 
                {
                    LogFatal("begin >= end");
                    return false;
                }
                TrieNode* p = _root;
                for (Unicode::const_iterator itr = begin; itr != end; itr++)
                {
                    if(p->hmap.find(*itr) == p-> hmap.end())
                    {
                        break;
                    }
                    p = p->hmap[*itr];
                    if(p->isLeaf)
                    {
                        uint pos = p->nodeInfoVecPos;
                        if(pos < _nodeInfoVec.size())
                        {
                            res.push_back(make_pair(itr-begin, &_nodeInfoVec[pos]));
                        }
                        else
                        {
                            LogFatal("node's nodeInfoVecPos is out of _nodeInfoVec's range");
                            return false;
                        }
                    }
                }
                return !res.empty();
            }